

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O0

void (anonymous_namespace)::DBHashKey::
     SerializationOps<DataStream,(anonymous_namespace)::DBHashKey_const,ActionSerialize>(void)

{
  long lVar1;
  long in_FS_OFFSET;
  uint8_t prefix;
  DataStream *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ActionSerialize::SerReadWriteMany<DataStream,unsigned_char>
            (in_stack_ffffffffffffff98,(uchar *)0x93c4d0);
  ActionSerialize::SerReadWriteMany<DataStream,uint256>
            (in_stack_ffffffffffffff98,(uint256 *)0x93c57a);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SERIALIZE_METHODS(DBHashKey, obj)
    {
        uint8_t prefix{DB_BLOCK_HASH};
        READWRITE(prefix);
        if (prefix != DB_BLOCK_HASH) {
            throw std::ios_base::failure("Invalid format for coinstatsindex DB hash key");
        }

        READWRITE(obj.block_hash);
    }